

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O0

void Ptex::v2_2::PtexUtils::anon_unknown_1::reduceu<Ptex::v2_2::PtexHalf>
               (PtexHalf *src,int sstride,int uw,int vw,PtexHalf *dst,int dstride,int nchan)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  undefined2 *in_R8;
  int in_R9D;
  float val;
  float fVar6;
  int in_stack_00000008;
  PtexHalf *pixend;
  PtexHalf *rowend;
  PtexHalf *end;
  int drowskip;
  int srowskip;
  int rowlen;
  undefined2 in_stack_ffffffffffffffb4;
  undefined2 in_stack_ffffffffffffffb6;
  undefined2 *local_20;
  long local_8;
  
  iVar1 = in_R9D / 2;
  iVar2 = in_EDX * in_stack_00000008;
  iVar3 = iVar1 - iVar2 / 2;
  local_20 = in_R8;
  for (local_8 = in_RDI; local_8 != in_RDI + (long)(in_ECX * (in_ESI / 2)) * 2;
      local_8 = local_8 + (long)(in_ESI / 2 - iVar2) * 2) {
    lVar4 = local_8 + (long)iVar2 * 2;
    for (; local_8 != lVar4; local_8 = local_8 + (long)in_stack_00000008 * 2) {
      lVar5 = local_8 + (long)in_stack_00000008 * 2;
      for (; local_8 != lVar5; local_8 = local_8 + 2) {
        val = PtexHalf::operator_cast_to_float((PtexHalf *)0xb18108);
        fVar6 = PtexHalf::operator_cast_to_float((PtexHalf *)0xb18123);
        halve(val + fVar6);
        PtexHalf::PtexHalf((PtexHalf *)
                           CONCAT26(in_stack_ffffffffffffffb6,
                                    CONCAT24(in_stack_ffffffffffffffb4,iVar1)),val);
        *local_20 = in_stack_ffffffffffffffb6;
        local_20 = local_20 + 1;
      }
    }
    local_20 = local_20 + iVar3;
  }
  return;
}

Assistant:

inline void reduceu(const T* src, int sstride, int uw, int vw,
                        T* dst, int dstride, int nchan)
    {
        sstride /= (int)sizeof(T);
        dstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int srowskip = sstride - rowlen;
        int drowskip = dstride - rowlen/2;
        for (const T* end = src + vw*sstride; src != end;
             src += srowskip, dst += drowskip)
            for (const T* rowend = src + rowlen; src != rowend; src += nchan)
                for (const T* pixend = src+nchan; src != pixend; src++)
                    *dst++ = T(halve(src[0] + src[nchan]));
    }